

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrHandleResult VerifyXrTriangleMeshFBHandle(XrTriangleMeshFB *handle_to_check)

{
  ValidateXrHandleResult VVar1;
  XrTriangleMeshFB *handle_to_check_local;
  
  VVar1 = HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
                    (&g_trianglemeshfb_info.
                      super_HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>,
                     handle_to_check);
  return VVar1;
}

Assistant:

ValidateXrHandleResult VerifyXrTriangleMeshFBHandle(const XrTriangleMeshFB* handle_to_check) {
    return g_trianglemeshfb_info.verifyHandle(handle_to_check);
}